

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O1

void __thiscall Minisat::OnlineProofChecker::uncheckedEnqueue(OnlineProofChecker *this,Lit p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = p.x >> 1;
  if (3 < *(int *)(this + 0xf8)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] enqueue literal ",0x1e);
    uVar2 = ~uVar3;
    if ((p.x & 1U) == 0) {
      uVar2 = uVar3 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cerr,uVar2);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  *(byte *)(*(long *)(this + 0xd8) + (long)(int)uVar3) = (byte)p.x & 1;
  iVar1 = *(int *)(this + 0xc0);
  *(int *)(this + 0xc0) = iVar1 + 1;
  *(int *)(*(long *)(this + 0xb8) + (long)iVar1 * 4) = p.x;
  return;
}

Assistant:

inline void OnlineProofChecker::uncheckedEnqueue(Lit p)
{
    DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] enqueue literal " << p << std::endl;);
    assigns[var(p)] = lbool(!sign(p));
    // prefetch watch lists
    __builtin_prefetch(&watches[p]);
    trail.push_(p);
}